

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O0

QByteArray * QByteArray::fromRawData(char *data,qsizetype size)

{
  long lVar1;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  DataPointer *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char>::fromRawData((char *)in_RDI,(qsizetype)in_RDI);
  QByteArray((QByteArray *)in_RDI,in_stack_ffffffffffffffa8);
  QArrayDataPointer<char>::~QArrayDataPointer(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] static QByteArray fromRawData(const char *data, qsizetype size)
    {
        return QByteArray(DataPointer::fromRawData(data, size));
    }